

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall ON_PolyCurve::SetStartPoint(ON_PolyCurve *this,ON_3dPoint start_point)

{
  ON_Curve *pOVar1;
  undefined1 uVar2;
  int iVar3;
  
  if (((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count < 1) ||
     (pOVar1 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a, pOVar1 == (ON_Curve *)0x0))
  {
    uVar2 = 0;
  }
  else {
    iVar3 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x39])();
    uVar2 = (undefined1)iVar3;
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return (bool)uVar2;
}

Assistant:

bool ON_PolyCurve::SetStartPoint(ON_3dPoint start_point)
{
  bool rc = false;
  // just do it // if ( !IsClosed() )
  {
    ON_Curve* c = FirstSegmentCurve();
    if ( c )
      rc = c->SetStartPoint(start_point);
  }
	DestroyCurveTree();
  return rc;
}